

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O2

Int __thiscall Json::Value::asInt(Value *this)

{
  double dVar1;
  bool bVar2;
  ulong uVar3;
  undefined8 extraout_RAX;
  long val;
  ostringstream oss;
  string local_1b0;
  ulong local_190;
  ValueHolder local_188 [47];
  
  uVar3 = (ulong)(byte)this->field_0x8;
  switch((ulong)(byte)this->field_0x8) {
  case 0:
    goto switchD_0011d353_caseD_0;
  case 1:
  case 3:
    bVar2 = isInt(this);
    if (!bVar2) {
      this = (Value *)local_188;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
      std::operator<<((ostream *)this,"LargestInt out of Int range");
      std::__cxx11::stringbuf::str();
      throwLogicError(&local_1b0);
      goto switchD_0011d353_caseD_2;
    }
    break;
  case 2:
switchD_0011d353_caseD_2:
    bVar2 = isInt(this);
    if (!bVar2) goto LAB_0011d483;
    break;
  case 4:
    dVar1 = (this->value_).real_;
    if ((-2147483648.0 <= dVar1) && (dVar1 <= 2147483647.0)) {
      uVar3 = (ulong)(uint)(int)dVar1;
      goto switchD_0011d353_caseD_0;
    }
    goto LAB_0011d4b8;
  case 5:
    asString_abi_cxx11_((string *)local_188,this);
    bVar2 = converToInt(local_188[0].string_,(long *)&local_190);
    std::__cxx11::string::~string((string *)&local_188[0].bool_);
    if (!bVar2) goto switchD_0011d353_default;
    uVar3 = local_190;
    if ((long)(int)local_190 == local_190) goto switchD_0011d353_caseD_0;
    this = (Value *)local_188;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
    std::operator<<((ostream *)this,"LargestInt out of Int range");
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1b0);
  case 6:
    uVar3 = (ulong)(byte)*(ostringstream *)this;
    goto switchD_0011d353_caseD_0;
  default:
switchD_0011d353_default:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188[0].bool_);
    std::operator<<((ostream *)&local_188[0].bool_,"Value is not convertible to Int.");
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1b0);
LAB_0011d483:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188[0].bool_);
    std::operator<<((ostream *)&local_188[0].bool_,"LargestUInt out of Int range");
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1b0);
LAB_0011d4b8:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188[0].bool_);
    std::operator<<((ostream *)&local_188[0].bool_,"double out of Int range");
    std::__cxx11::stringbuf::str();
    throwLogicError(&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188[0].bool_);
    _Unwind_Resume(extraout_RAX);
  }
  uVar3 = (ulong)*(uint *)this;
switchD_0011d353_caseD_0:
  return (Int)uVar3;
}

Assistant:

Value::Int Value::asInt() const {
  switch (type_) {
#if defined(JSON_HAS_INT64)
  case int64Value:
#endif
  case intValue:
    JSON_ASSERT_MESSAGE(isInt(), "LargestInt out of Int range");
    return Int(value_.int_);
  case uintValue:
    JSON_ASSERT_MESSAGE(isInt(), "LargestUInt out of Int range");
    return Int(value_.uint_);
  case realValue:
    JSON_ASSERT_MESSAGE(InRange(value_.real_, minInt, maxInt),
                        "double out of Int range");
    return Int(value_.real_);
  case nullValue:
    return 0;
  case booleanValue:
    return value_.bool_ ? 1 : 0;
  case stringValue: {
    long int val;

    if (!converToInt (asString().c_str(), &val)) {
      break;
    }

    JSON_ASSERT_MESSAGE(IsInRange (val, minInt, maxInt),
                        "LargestInt out of Int range");
    return Int(val);
  }
  default:
    break;
  }
  JSON_FAIL_MESSAGE("Value is not convertible to Int.");
}